

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockchain.cpp
# Opt level: O2

CBlock * GetBlockChecked(CBlock *__return_storage_ptr__,BlockManager *blockman,
                        CBlockIndex *blockindex)

{
  long lVar1;
  bool bVar2;
  UniValue *__return_storage_ptr___00;
  long in_FS_OFFSET;
  allocator<char> local_49;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock32;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CBlock::CBlock(__return_storage_ptr__);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock32,&cs_main,"cs_main",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/blockchain.cpp"
             ,0x26d,false);
  CheckBlockDataAvailability(blockman,blockindex,false);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock32.super_unique_lock);
  bVar2 = node::BlockManager::ReadBlockFromDisk(blockman,__return_storage_ptr__,blockindex);
  if (bVar2) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return __return_storage_ptr__;
    }
  }
  else {
    __return_storage_ptr___00 = (UniValue *)__cxa_allocate_exception(0x58);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&criticalblock32,"Block not found on disk",&local_49);
    JSONRPCError(__return_storage_ptr___00,-1,(string *)&criticalblock32);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(__return_storage_ptr___00,&UniValue::typeinfo,UniValue::~UniValue);
    }
  }
  __stack_chk_fail();
}

Assistant:

static CBlock GetBlockChecked(BlockManager& blockman, const CBlockIndex& blockindex)
{
    CBlock block;
    {
        LOCK(cs_main);
        CheckBlockDataAvailability(blockman, blockindex, /*check_for_undo=*/false);
    }

    if (!blockman.ReadBlockFromDisk(block, blockindex)) {
        // Block not found on disk. This shouldn't normally happen unless the block was
        // pruned right after we released the lock above.
        throw JSONRPCError(RPC_MISC_ERROR, "Block not found on disk");
    }

    return block;
}